

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O0

DatFile * __thiscall DatUnpacker::DatFile::operator<<(DatFile *this,unsigned_short value)

{
  unsigned_short local_12;
  DatFile *pDStack_10;
  unsigned_short value_local;
  DatFile *this_local;
  
  local_12 = value;
  pDStack_10 = this;
  if (this->_endianness == Big) {
    local_12 = _swap(this,value);
  }
  std::ostream::write((char *)&this->_ofstream,(long)&local_12);
  std::ostream::flush();
  return this;
}

Assistant:

DatFile& DatFile::operator<<(unsigned short value)
    {
        if (_endianness == Endianness::Big)
        {
            value = _swap(value);
        }
        _ofstream.write((char*)&value, 2);
        _ofstream.flush();

        return *this;
    }